

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * QLocale::languageToCode
                    (QString *__return_storage_ptr__,Language language,LanguageCodeTypes codeTypes)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  _Type local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = (_Type)QLocalePrivate::languageToCode(language,codeTypes);
  qVar1 = QtPrivate::lengthHelperPointer<char>(local_1c);
  latin1.m_data = local_1c;
  latin1.m_size = qVar1;
  QString::QString(__return_storage_ptr__,latin1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::languageToCode(Language language, LanguageCodeTypes codeTypes)
{
    const auto code = QLocalePrivate::languageToCode(language, codeTypes);
    return QLatin1StringView{code.data()};
}